

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_e9e4d4::MiniscriptDescriptor::MakeScripts
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,
          MiniscriptDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *keys,
          Span<const_CScript> scripts,FlatSigningProvider *provider)

{
  byte bVar1;
  MiniscriptContext ms_ctx;
  Fragment FVar2;
  pointer pCVar3;
  Node<unsigned_int> *pNVar4;
  pointer psVar5;
  uint32_t *puVar6;
  undefined8 uVar7;
  pointer pSVar8;
  ScriptMaker *pSVar9;
  undefined7 uVar10;
  bool bVar11;
  CScript *pCVar12;
  opcodetype oVar13;
  opcodetype oVar14;
  opcodetype oVar16;
  ulong uVar17;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CPubKey *key;
  pointer this_01;
  uint *key_1;
  uint32_t *puVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  vector<CScript,_std::allocator<CScript>_> results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  bool local_11d;
  opcodetype local_11c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  opcodetype local_100;
  opcodetype local_fc;
  ScriptMaker local_f8;
  ScriptMaker *local_e8;
  bool local_e0 [8];
  direct_or_indirect local_d8;
  opcodetype local_bc;
  bool child_state;
  undefined7 uStack_b7;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  undefined4 local_9c;
  bool local_98;
  _Storage<CScript,_false> local_88;
  char local_68;
  uint160 id;
  uchar auStack_44 [8];
  size_type local_3c;
  long local_38;
  uint uVar15;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ms_ctx = ((this->m_node).
            super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->m_script_ctx;
  pCVar3 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pCVar3; this_01 = this_01 + 1) {
    bVar11 = miniscript::IsTapscript(ms_ctx);
    if (bVar11) {
      XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)&local_88._M_value,this_01);
      Hash160<XOnlyPubKey>((uint160 *)&child_state,(XOnlyPubKey *)&local_88._M_value);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<uint160,CPubKey_const&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)&provider->pubkeys,(uint160 *)&child_state,this_01);
    }
    else {
      CPubKey::GetID((CKeyID *)&local_88._M_value,this_01);
      std::
      _Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
      ::_M_emplace_unique<CKeyID,CPubKey_const&>
                ((_Rb_tree<CKeyID,std::pair<CKeyID_const,CPubKey>,std::_Select1st<std::pair<CKeyID_const,CPubKey>>,std::less<CKeyID>,std::allocator<std::pair<CKeyID_const,CPubKey>>>
                  *)&provider->pubkeys,(CKeyID *)&local_88._M_value,this_01);
    }
  }
  pNVar4 = (this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_f8.m_keys = keys;
  local_f8.m_script_ctx = ms_ctx;
  local_e0[0] = miniscript::IsTapscript(pNVar4->m_script_ctx);
  local_11d = false;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_88._0_8_ = (ulong)(uint)local_88._4_4_ << 0x20;
  local_e8 = &local_f8;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)#1}>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac...)#1})const::{lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)#1})const::StackElem>>
  ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac___)_1_)const::_lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_)const::StackElem>>
              *)&stack,pNVar4,(int *)&local_88,&local_11d);
LAB_0031df23:
  do {
    pSVar9 = local_e8;
    pSVar8 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if ((long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_start != 0x20) {
        __assert_fail("results.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0x27e,
                      "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = CScript, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:731:23), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:664:13)]"
                     );
      }
      _child_state = ((results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                       super__Vector_impl_data._M_start)->super_CScriptBase)._union.
                     indirect_contents.indirect;
      uVar7 = *(undefined8 *)
               ((long)&((results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                         super__Vector_impl_data._M_start)->super_CScriptBase)._union + 8);
      uStack_a4 = *(undefined8 *)
                   ((long)&((results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                             super__Vector_impl_data._M_start)->super_CScriptBase)._union + 0x14);
      uStack_a8 = (undefined4)
                  ((ulong)*(undefined8 *)
                           ((long)&((results.super__Vector_base<CScript,_std::allocator<CScript>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->super_CScriptBase).
                                   _union + 0xc) >> 0x20);
      uStack_b0 = (undefined4)uVar7;
      uStack_ac = (undefined4)((ulong)uVar7 >> 0x20);
      oVar16 = ((results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_CScriptBase)._size;
      ((results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_start)->super_CScriptBase)._size = 0;
      local_98 = true;
LAB_0031e976:
      std::vector<CScript,_std::allocator<CScript>_>::~vector(&results);
      std::vector<StackElem,_std::allocator<StackElem>_>::~vector(&stack);
      local_d8.indirect_contents.indirect = (char *)_child_state;
      local_d8.indirect_contents.capacity = uStack_b0;
      local_d8._12_4_ = uStack_ac;
      local_d8._16_4_ = uStack_a8;
      local_d8._20_8_ = uStack_a4;
      local_9c = 0;
      local_bc = oVar16;
      std::_Optional_payload_base<CScript>::_M_reset
                ((_Optional_payload_base<CScript> *)&child_state);
      Vector<CScript>(__return_storage_ptr__,(CScript *)&local_d8.indirect_contents);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    pNVar4 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].node;
    uVar17 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].expanded;
    psVar5 = (pNVar4->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = (long)(pNVar4->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4;
    uVar10 = uStack_b7;
    if (uVar17 < uVar19) break;
    if ((ulong)((long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5) < uVar19) {
      __assert_fail("results.size() >= node.subs.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0x273,
                    "std::optional<Result> miniscript::Node<unsigned int>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = unsigned int, Result = CScript, State = bool, DownFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:731:23), UpFn = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h:664:13)]"
                   );
    }
    if (MULTI_A < pNVar4->fragment) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,799,
                    "auto miniscript::Node<unsigned int>::ToScript(const (anonymous namespace)::ScriptMaker &)::(anonymous class)::operator()(bool, const Node<Key> &, Span<CScript>) const [Key = unsigned int]"
                   );
    }
    pCVar12 = (CScript *)
              ((long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                     super__Vector_impl_data._M_start +
              uVar19 * -0x20 +
              ((long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                    super__Vector_impl_data._M_start));
    bVar1 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].field_0x10;
    oVar13 = (opcodetype)bVar1;
    oVar16 = (opcodetype)bVar1;
    oVar14 = (opcodetype)bVar1;
    uVar15 = (uint)bVar1;
    switch(pNVar4->fragment) {
    case JUST_0:
      _child_state = _child_state & 0xffffffff00000000;
      BuildScript<opcodetype>((CScript *)&id,(opcodetype *)&child_state);
      break;
    case JUST_1:
      _child_state = 0x51;
      BuildScript<opcodetype>((CScript *)&id,(opcodetype *)&child_state);
      break;
    case PK_K:
      ScriptMaker::ToPKBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&child_state,local_e8,
                 *(pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start);
      BuildScript<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((CScript *)&id,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&child_state);
      this_00 = (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&child_state;
      goto LAB_0031e889;
    case PK_H:
      local_fc = OP_DUP;
      local_100 = OP_HASH160;
      uVar15 = *(pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      bVar11 = miniscript::IsTapscript(local_e8->m_script_ctx);
      if (bVar11) {
        XOnlyPubKey::XOnlyPubKey
                  ((XOnlyPubKey *)&child_state,
                   (pSVar9->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar15);
        Hash160<XOnlyPubKey>(&id,(XOnlyPubKey *)&child_state);
      }
      else {
        CPubKey::GetID((CKeyID *)&id,
                       (pSVar9->m_keys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar15);
      }
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_118,(uchar *)&id,
                 auStack_44,(allocator_type *)&child_state);
      _child_state = 0x88;
      BuildScript<opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                ((CScript *)&id,&local_fc,&local_100,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,
                 (opcodetype *)&child_state);
      this_00 = &local_118;
LAB_0031e889:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this_00);
      break;
    case OLDER:
      _child_state = 0xb2;
      BuildScript<unsigned_int_const&,opcodetype>
                ((CScript *)&id,&pNVar4->k,(opcodetype *)&child_state);
      break;
    case AFTER:
      _child_state = 0xb1;
      BuildScript<unsigned_int_const&,opcodetype>
                ((CScript *)&id,&pNVar4->k,(opcodetype *)&child_state);
      break;
    case SHA256:
      _child_state = 0x82;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
      local_fc = OP_EQUALVERIFY;
      local_100 = OP_SHA256;
      oVar16 = uVar15 + OP_EQUAL;
      local_11c = oVar16;
      BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,(int *)&local_118,&local_fc,&local_100,
                 &pNVar4->data,&local_11c);
      break;
    case HASH256:
      _child_state = 0x82;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
      local_fc = OP_EQUALVERIFY;
      local_100 = OP_HASH256;
      oVar16 = uVar15 + OP_EQUAL;
      local_11c = oVar16;
      BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,(int *)&local_118,&local_fc,&local_100,
                 &pNVar4->data,&local_11c);
      break;
    case RIPEMD160:
      _child_state = 0x82;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
      local_fc = OP_EQUALVERIFY;
      local_100 = OP_RIPEMD160;
      oVar16 = uVar15 + OP_EQUAL;
      local_11c = oVar16;
      BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,(int *)&local_118,&local_fc,&local_100,
                 &pNVar4->data,&local_11c);
      break;
    case HASH160:
      _child_state = 0x82;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x20);
      local_fc = OP_EQUALVERIFY;
      local_100 = OP_HASH160;
      oVar16 = uVar15 + OP_EQUAL;
      local_11c = oVar16;
      BuildScript<opcodetype,int,opcodetype,opcodetype,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,(int *)&local_118,&local_fc,&local_100,
                 &pNVar4->data,&local_11c);
      break;
    case WRAP_A:
      _child_state = 0x6b;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x6c);
      BuildScript<opcodetype,CScript&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,pCVar12,(opcodetype *)&local_118);
      break;
    case WRAP_S:
      _child_state = 0x7c;
      BuildScript<opcodetype,CScript&>((CScript *)&id,(opcodetype *)&child_state,pCVar12);
      break;
    case WRAP_C:
      oVar16 = oVar14 | OP_CHECKSIG;
      _child_state = CONCAT44(uStack_b7._3_4_,oVar14) | 0xac;
      BuildScript<CScript,opcodetype>((CScript *)&id,pCVar12,(opcodetype *)&child_state);
      break;
    case WRAP_D:
      _child_state = 0x76;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,99);
      local_fc = OP_ENDIF;
      BuildScript<opcodetype,opcodetype,CScript&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,(opcodetype *)&local_118,pCVar12,
                 &local_fc);
      break;
    case WRAP_V:
      if ((*(byte *)((long)(psVar5->
                           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + 0x91) & 0x20) == 0) {
        id.super_base_blob<160U>.m_data._M_elems._0_8_ =
             (pCVar12->super_CScriptBase)._union.indirect_contents.indirect;
        uVar7 = *(undefined8 *)((long)&(pCVar12->super_CScriptBase)._union + 8);
        auStack_44 = *(uchar (*) [8])((long)&(pCVar12->super_CScriptBase)._union + 0x14);
        id.super_base_blob<160U>.m_data._M_elems._16_4_ =
             SUB84((ulong)*(undefined8 *)((long)&(pCVar12->super_CScriptBase)._union + 0xc) >> 0x20,
                   0);
        id.super_base_blob<160U>.m_data._M_elems._8_4_ = SUB84(uVar7,0);
        id.super_base_blob<160U>.m_data._M_elems._12_4_ = SUB84((ulong)uVar7 >> 0x20,0);
        local_3c = (pCVar12->super_CScriptBase)._size;
        (pCVar12->super_CScriptBase)._size = 0;
      }
      else {
        _child_state = 0x69;
        BuildScript<CScript,opcodetype>((CScript *)&id,pCVar12,(opcodetype *)&child_state);
      }
      break;
    case WRAP_J:
      _child_state = 0x82;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x92);
      local_fc = OP_IF;
      local_100 = OP_ENDIF;
      BuildScript<opcodetype,opcodetype,opcodetype,CScript&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,(opcodetype *)&local_118,&local_fc,
                 pCVar12,&local_100);
      break;
    case WRAP_N:
      _child_state = 0x92;
      BuildScript<CScript,opcodetype>((CScript *)&id,pCVar12,(opcodetype *)&child_state);
      break;
    case AND_V:
      BuildScript<CScript,CScript&>((CScript *)&id,pCVar12,pCVar12 + 1);
      break;
    case AND_B:
      _child_state = 0x9a;
      BuildScript<CScript,CScript&,opcodetype>
                ((CScript *)&id,pCVar12,pCVar12 + 1,(opcodetype *)&child_state);
      break;
    case OR_B:
      _child_state = 0x9b;
      BuildScript<CScript,CScript&,opcodetype>
                ((CScript *)&id,pCVar12,pCVar12 + 1,(opcodetype *)&child_state);
      break;
    case OR_C:
      _child_state = 100;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x68);
      BuildScript<CScript,opcodetype,CScript&,opcodetype>
                ((CScript *)&id,pCVar12,(opcodetype *)&child_state,pCVar12 + 1,
                 (opcodetype *)&local_118);
      break;
    case OR_D:
      _child_state = 0x73;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,100);
      local_fc = OP_ENDIF;
      BuildScript<CScript,opcodetype,opcodetype,CScript&,opcodetype>
                ((CScript *)&id,pCVar12,(opcodetype *)&child_state,(opcodetype *)&local_118,
                 pCVar12 + 1,&local_fc);
      oVar16 = oVar13;
      break;
    case OR_I:
      _child_state = 99;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x67);
      local_fc = OP_ENDIF;
      BuildScript<opcodetype,CScript&,opcodetype,CScript&,opcodetype>
                ((CScript *)&id,(opcodetype *)&child_state,pCVar12,(opcodetype *)&local_118,
                 pCVar12 + 1,&local_fc);
      oVar16 = oVar13;
      break;
    case ANDOR:
      _child_state = 100;
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x67);
      local_fc = OP_ENDIF;
      BuildScript<CScript,opcodetype,CScript&,opcodetype,CScript&,opcodetype>
                ((CScript *)&id,pCVar12,(opcodetype *)&child_state,pCVar12 + 2,
                 (opcodetype *)&local_118,pCVar12 + 1,&local_fc);
      oVar16 = oVar13;
      break;
    case THRESH:
      _child_state = (pCVar12->super_CScriptBase)._union.indirect_contents.indirect;
      uVar7 = *(undefined8 *)((long)&(pCVar12->super_CScriptBase)._union + 8);
      uStack_a4 = *(undefined8 *)((long)&(pCVar12->super_CScriptBase)._union + 0x14);
      uStack_a8 = (undefined4)
                  ((ulong)*(undefined8 *)((long)&(pCVar12->super_CScriptBase)._union + 0xc) >> 0x20)
      ;
      uStack_b0 = (undefined4)uVar7;
      uStack_ac = (undefined4)((ulong)uVar7 >> 0x20);
      local_9c = (pCVar12->super_CScriptBase)._size;
      (pCVar12->super_CScriptBase)._size = 0;
      pCVar12 = results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                super__Vector_impl_data._M_finish + -uVar19;
      uVar17 = 1;
      while( true ) {
        pCVar12 = pCVar12 + 1;
        if (uVar19 <= uVar17) break;
        local_118._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0x93);
        BuildScript<CScript,CScript&,opcodetype>
                  ((CScript *)&id,(CScript *)&child_state,pCVar12,(opcodetype *)&local_118);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&child_state,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
        uVar17 = uVar17 + 1;
      }
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,
                             oVar14 + OP_EQUAL);
      BuildScript<CScript,unsigned_int_const&,opcodetype>
                ((CScript *)&id,(CScript *)&child_state,&pNVar4->k,(opcodetype *)&local_118);
      goto LAB_0031e7ee;
    case MULTI:
      _child_state = CONCAT71(uVar10,local_e0[0]) ^ 1;
      inline_check_non_fatal<bool>
                (&child_state,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                 ,0x308,"operator()","!is_tapscript");
      BuildScript<unsigned_int_const&>((CScript *)&child_state,&pNVar4->k);
      puVar6 = (pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (puVar18 = (pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start; puVar18 != puVar6;
          puVar18 = puVar18 + 1) {
        ScriptMaker::ToPKBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,local_e8,
                   *puVar18);
        BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((CScript *)&id,(CScript *)&child_state,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&child_state,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
      }
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)(pNVar4->keys).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pNVar4->keys).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
      local_fc = oVar14 | OP_CHECKMULTISIG;
      uVar17 = (ulong)local_fc;
      BuildScript<CScript,unsigned_long,opcodetype>
                ((CScript *)&id,(CScript *)&child_state,(unsigned_long *)&local_118,&local_fc);
      goto LAB_0031e7ee;
    case MULTI_A:
      inline_check_non_fatal<bool_const&>
                (local_e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                 ,0x310,"operator()","is_tapscript");
      ScriptMaker::ToPKBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&id,local_e8,
                 *(pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start);
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,0xac);
      BuildScript<std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                ((CScript *)&child_state,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&id,
                 (opcodetype *)&local_118);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&id);
      puVar18 = (pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (puVar18 = puVar18 + 1,
            puVar18 !=
            (pNVar4->keys).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
        ScriptMaker::ToPKBytes
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,local_e8,
                   *puVar18);
        local_fc = OP_CHECKSIGADD;
        BuildScript<CScript,std::vector<unsigned_char,std::allocator<unsigned_char>>,opcodetype>
                  ((CScript *)&id,(CScript *)&child_state,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118,&local_fc);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&child_state,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_118);
      }
      uVar17 = (ulong)(oVar14 | OP_NUMEQUAL);
      local_118._M_impl.super__Vector_impl_data._M_start =
           (pointer)(CONCAT44(local_118._M_impl.super__Vector_impl_data._M_start._4_4_,oVar14) |
                    0x9c);
      BuildScript<CScript,unsigned_int_const&,opcodetype>
                ((CScript *)&id,(CScript *)&child_state,&pNVar4->k,(opcodetype *)&local_118);
LAB_0031e7ee:
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&child_state);
      oVar16 = (opcodetype)uVar17;
    }
    local_88._16_1_ = id.super_base_blob<160U>.m_data._M_elems[0x10];
    local_88._17_1_ = id.super_base_blob<160U>.m_data._M_elems[0x11];
    local_88._18_1_ = id.super_base_blob<160U>.m_data._M_elems[0x12];
    local_88._19_1_ = id.super_base_blob<160U>.m_data._M_elems[0x13];
    local_88._20_1_ = auStack_44[0];
    local_88._21_1_ = auStack_44[1];
    local_88._22_1_ = auStack_44[2];
    local_88._23_1_ = auStack_44[3];
    local_88._24_1_ = auStack_44[4];
    local_88._25_1_ = auStack_44[5];
    local_88._26_1_ = auStack_44[6];
    local_88._27_1_ = auStack_44[7];
    local_88._0_1_ = id.super_base_blob<160U>.m_data._M_elems[0];
    local_88._1_1_ = id.super_base_blob<160U>.m_data._M_elems[1];
    local_88._2_1_ = id.super_base_blob<160U>.m_data._M_elems[2];
    local_88._3_1_ = id.super_base_blob<160U>.m_data._M_elems[3];
    local_88._4_1_ = id.super_base_blob<160U>.m_data._M_elems[4];
    local_88._5_1_ = id.super_base_blob<160U>.m_data._M_elems[5];
    local_88._6_1_ = id.super_base_blob<160U>.m_data._M_elems[6];
    local_88._7_1_ = id.super_base_blob<160U>.m_data._M_elems[7];
    local_88._8_1_ = id.super_base_blob<160U>.m_data._M_elems[8];
    local_88._9_1_ = id.super_base_blob<160U>.m_data._M_elems[9];
    local_88._10_1_ = id.super_base_blob<160U>.m_data._M_elems[10];
    local_88._11_1_ = id.super_base_blob<160U>.m_data._M_elems[0xb];
    local_88._12_1_ = id.super_base_blob<160U>.m_data._M_elems[0xc];
    local_88._13_1_ = id.super_base_blob<160U>.m_data._M_elems[0xd];
    local_88._14_1_ = id.super_base_blob<160U>.m_data._M_elems[0xe];
    local_88._15_1_ = id.super_base_blob<160U>.m_data._M_elems[0xf];
    local_88._M_value.super_CScriptBase._size = local_3c;
    local_3c = 0;
    local_68 = '\x01';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&id);
    if (local_68 == '\0') {
      local_98 = false;
      std::_Optional_payload_base<CScript>::_M_reset
                ((_Optional_payload_base<CScript> *)&local_88._M_value);
      goto LAB_0031e976;
    }
    std::vector<CScript,_std::allocator<CScript>_>::erase
              (&results,(CScript *)
                        ((long)results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl
                               .super__Vector_impl_data._M_finish +
                        ((long)(pNVar4->subs).
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pNVar4->subs).
                              super__Vector_base<std::shared_ptr<const_miniscript::Node<unsigned_int>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) * -2),
               (const_iterator)
               results.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<CScript,_std::allocator<CScript>_>::emplace_back<CScript>
              (&results,&local_88._M_value);
    stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
    _M_finish = pSVar8 + -1;
    std::_Optional_payload_base<CScript>::_M_reset
              ((_Optional_payload_base<CScript> *)&local_88._M_value);
  } while( true );
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1].expanded = uVar17 + 1;
  FVar2 = pNVar4->fragment;
  child_state = (bool)stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].field_0x10;
  if (((FVar2 != WRAP_S) && (child_state = (bool)1, FVar2 != WRAP_V)) &&
     (child_state = (bool)stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
                          super__Vector_impl_data._M_finish[-1].field_0x10,
     uVar17 != 1 || FVar2 != AND_V)) {
    child_state = (bool)0;
  }
  local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
  std::
  vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1},miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)#1}>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::{lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)#1}&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac...)#1})const::{lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)#1})const::StackElem>>
  ::emplace_back<miniscript::Node<unsigned_int>const&,int,bool>
            ((vector<miniscript::Node<unsigned_int>::TreeEvalMaybe<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_,miniscript::Node<unsigned_int>::TreeEval<CScript,bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_>(bool,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespace)::ScriptMaker_const&)const::_lambda(bool,miniscript::Node<unsigned_int>const&,unsigned_long)_1_&,miniscript::Node<unsigned_int>::ToScript<(anonymous_namespace)::ScriptMaker>((anonymous_namespac___)_1_)const::_lambda(bool&&,miniscript::Node<unsigned_int>const&,Span<CScript>)_1_)const::StackElem>>
              *)&stack,
             psVar5[uVar17].
             super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(int *)&local_88,&child_state);
  goto LAB_0031df23;
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>& keys, Span<const CScript> scripts,
                                     FlatSigningProvider& provider) const override
    {
        const auto script_ctx{m_node->GetMsCtx()};
        for (const auto& key : keys) {
            if (miniscript::IsTapscript(script_ctx)) {
                provider.pubkeys.emplace(Hash160(XOnlyPubKey{key}), key);
            } else {
                provider.pubkeys.emplace(key.GetID(), key);
            }
        }
        return Vector(m_node->ToScript(ScriptMaker(keys, script_ctx)));
    }